

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_schnorrsig_compute_sigpoint
              (secp256k1_context *ctx,secp256k1_pubkey *sigpoint,uchar *msg32,
              secp256k1_xonly_pubkey *rx,secp256k1_xonly_pubkey *pubkey)

{
  int iVar1;
  undefined1 local_330 [8];
  secp256k1_ge sigpoint_ge;
  secp256k1_gej sigpoint_gej;
  secp256k1_scalar e;
  secp256k1_ge nonce_ge;
  secp256k1_ge pubkey_ge;
  secp256k1_gej pubkey_gej;
  uchar buf [32];
  undefined1 local_e0 [8];
  secp256k1_sha256 sha;
  uchar rx_buf [32];
  uchar pk_buf [32];
  secp256k1_xonly_pubkey *pubkey_local;
  secp256k1_xonly_pubkey *rx_local;
  uchar *msg32_local;
  secp256k1_pubkey *sigpoint_local;
  secp256k1_context *ctx_local;
  
  iVar1 = secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx);
  if (iVar1 == 0) {
    secp256k1_callback_call
              (&ctx->illegal_callback,"secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx)");
    ctx_local._4_4_ = 0;
  }
  else if (msg32 == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"msg32 != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (rx == (secp256k1_xonly_pubkey *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"rx != NULL");
    ctx_local._4_4_ = 0;
  }
  else if (pubkey == (secp256k1_xonly_pubkey *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"pubkey != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    secp256k1_xonly_pubkey_serialize(ctx,rx_buf + 0x18,pubkey);
    secp256k1_xonly_pubkey_serialize(ctx,(uchar *)&sha.bytes,rx);
    secp256k1_schnorrsig_sha256_tagged((secp256k1_sha256 *)local_e0);
    secp256k1_sha256_write((secp256k1_sha256 *)local_e0,(uchar *)&sha.bytes,0x20);
    secp256k1_sha256_write((secp256k1_sha256 *)local_e0,rx_buf + 0x18,0x20);
    secp256k1_sha256_write((secp256k1_sha256 *)local_e0,msg32,0x20);
    secp256k1_sha256_finalize((secp256k1_sha256 *)local_e0,(uchar *)&pubkey_gej.infinity);
    secp256k1_scalar_set_b32
              ((secp256k1_scalar *)&sigpoint_gej.infinity,(uchar *)&pubkey_gej.infinity,(int *)0x0);
    iVar1 = secp256k1_xonly_pubkey_load(ctx,(secp256k1_ge *)&nonce_ge.infinity,pubkey);
    if (iVar1 == 0) {
      ctx_local._4_4_ = 0;
    }
    else {
      iVar1 = secp256k1_eckey_pubkey_tweak_mul
                        (&ctx->ecmult_ctx,(secp256k1_ge *)&nonce_ge.infinity,
                         (secp256k1_scalar *)&sigpoint_gej.infinity);
      if (iVar1 == 0) {
        ctx_local._4_4_ = 0;
      }
      else {
        iVar1 = secp256k1_xonly_pubkey_load(ctx,(secp256k1_ge *)(e.d + 3),rx);
        if (iVar1 == 0) {
          ctx_local._4_4_ = 0;
        }
        else {
          secp256k1_gej_set_ge
                    ((secp256k1_gej *)&pubkey_ge.infinity,(secp256k1_ge *)&nonce_ge.infinity);
          secp256k1_gej_add_ge
                    ((secp256k1_gej *)&sigpoint_ge.infinity,(secp256k1_gej *)&pubkey_ge.infinity,
                     (secp256k1_ge *)(e.d + 3));
          secp256k1_ge_set_gej((secp256k1_ge *)local_330,(secp256k1_gej *)&sigpoint_ge.infinity);
          secp256k1_pubkey_save(sigpoint,(secp256k1_ge *)local_330);
          ctx_local._4_4_ = 1;
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_schnorrsig_compute_sigpoint(const secp256k1_context* ctx, secp256k1_pubkey *sigpoint, const unsigned char *msg32, const secp256k1_xonly_pubkey *rx, const secp256k1_xonly_pubkey *pubkey) {
    unsigned char pk_buf[32];
    unsigned char rx_buf[32];
    secp256k1_sha256 sha;
    unsigned char buf[32];
    secp256k1_gej pubkey_gej;
    secp256k1_ge pubkey_ge;
    secp256k1_ge nonce_ge;
    secp256k1_scalar e;
    secp256k1_gej sigpoint_gej;
    secp256k1_ge sigpoint_ge;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(rx != NULL);
    ARG_CHECK(pubkey != NULL);

    secp256k1_xonly_pubkey_serialize(ctx, pk_buf, pubkey);
    secp256k1_xonly_pubkey_serialize(ctx, rx_buf, rx);

    /* tagged hash(r.x, pk.x, msg32) */
    secp256k1_schnorrsig_sha256_tagged(&sha);
    secp256k1_sha256_write(&sha, rx_buf, 32);
    secp256k1_sha256_write(&sha, pk_buf, 32);
    secp256k1_sha256_write(&sha, msg32, 32);
    secp256k1_sha256_finalize(&sha, buf);

    secp256k1_scalar_set_b32(&e, buf, NULL);

    if (!secp256k1_xonly_pubkey_load(ctx, &pubkey_ge, pubkey)) {
        return 0;
    }

    if (!secp256k1_eckey_pubkey_tweak_mul(&ctx->ecmult_ctx, &pubkey_ge, &e)) {
        return 0;
    }

    if (!secp256k1_xonly_pubkey_load(ctx, &nonce_ge, rx)) {
        return 0;
    }

    secp256k1_gej_set_ge(&pubkey_gej, &pubkey_ge);
    secp256k1_gej_add_ge(&sigpoint_gej, &pubkey_gej, &nonce_ge);

    secp256k1_ge_set_gej(&sigpoint_ge, &sigpoint_gej);
    secp256k1_pubkey_save(sigpoint, &sigpoint_ge);

    return 1;
}